

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::
DoSimdConvert<wabt::interp::Simd<double,(unsigned_char)2>,wabt::interp::Simd<float,(unsigned_char)4>,true>
          (Thread *this)

{
  u8 i;
  long lVar1;
  Simd<float,_(unsigned_char)__x04_> SVar2;
  Simd<double,_(unsigned_char)__x02_> result;
  Simd<float,_(unsigned_char)__x04_> val;
  anon_union_16_6_113bff37_for_Value_0 local_28;
  float local_18 [4];
  
  SVar2 = Pop<wabt::interp::Simd<float,(unsigned_char)4>>(this);
  local_18[0] = SVar2.v[0];
  local_18[1] = SVar2.v[1];
  local_18[2] = SVar2.v[2];
  local_18[3] = SVar2.v[3];
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    *(double *)((long)&local_28 + lVar1 * 8) = (double)local_18[lVar1];
  }
  Push(this,(Value)local_28.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdConvert() {
  using SL = typename S::LaneType;
  auto val = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = Convert<SL>(val[(low ? 0 : S::lanes) + i]);
  }
  Push(result);
  return RunResult::Ok;
}